

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O0

void __thiscall Assimp::ASE::Parser::ParseLV1MaterialListBlock(Parser *this)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  reference mat;
  Material *sMat;
  uint iIndex;
  allocator<char> local_321;
  string local_320;
  Material local_300;
  int local_1c;
  uint local_18;
  uint iOldMaterialCount;
  uint iMaterialCount;
  int iDepth;
  Parser *this_local;
  
  iOldMaterialCount = 0;
  local_18 = 0;
  _iMaterialCount = this;
  sVar3 = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::size
                    (&this->m_vMaterials);
  local_1c = (int)sVar3;
  do {
    while (*this->filePtr != '*') {
      if (*this->filePtr == '{') {
        iOldMaterialCount = iOldMaterialCount + 1;
      }
      else if (*this->filePtr == '}') {
        iOldMaterialCount = iOldMaterialCount - 1;
        if (iOldMaterialCount == 0) {
          this->filePtr = this->filePtr + 1;
          SkipToNextToken(this);
          return;
        }
      }
      else if (*this->filePtr == '\0') {
        return;
      }
LAB_0062c97a:
      bVar1 = IsLineEnd<char>(*this->filePtr);
      if ((bVar1) && ((this->bLastWasEndLine & 1U) == 0)) {
        this->iLineNumber = this->iLineNumber + 1;
        this->bLastWasEndLine = true;
      }
      else {
        this->bLastWasEndLine = false;
      }
      this->filePtr = this->filePtr + 1;
    }
    this->filePtr = this->filePtr + 1;
    bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL_COUNT",0xe);
    if (bVar1) {
      ParseLV4MeshLong(this,&local_18);
      uVar2 = local_1c + local_18;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"INVALID",&local_321);
      ASE::Material::Material(&local_300,&local_320);
      std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::resize
                (&this->m_vMaterials,(ulong)uVar2,&local_300);
      ASE::Material::~Material(&local_300);
      std::__cxx11::string::~string((string *)&local_320);
      std::allocator<char>::~allocator(&local_321);
    }
    else {
      bVar1 = TokenMatch<char_const>(&this->filePtr,"MATERIAL",8);
      if (!bVar1) goto LAB_0062c97a;
      sMat._0_4_ = 0;
      ParseLV4MeshLong(this,(uint *)&sMat);
      if (local_18 <= (uint)sMat) {
        LogWarning(this,"Out of range: material index is too large");
        sMat._0_4_ = local_18 - 1;
      }
      mat = std::vector<Assimp::ASE::Material,_std::allocator<Assimp::ASE::Material>_>::operator[]
                      (&this->m_vMaterials,(ulong)((uint)sMat + local_1c));
      ParseLV2MaterialBlock(this,mat);
    }
  } while( true );
}

Assistant:

void Parser::ParseLV1MaterialListBlock()
{
    AI_ASE_PARSER_INIT();

    unsigned int iMaterialCount = 0;
    unsigned int iOldMaterialCount = (unsigned int)m_vMaterials.size();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"MATERIAL_COUNT",14))
            {
                ParseLV4MeshLong(iMaterialCount);

                // now allocate enough storage to hold all materials
                m_vMaterials.resize(iOldMaterialCount+iMaterialCount, Material("INVALID"));
                continue;
            }
            if (TokenMatch(filePtr,"MATERIAL",8))
            {
                unsigned int iIndex = 0;
                ParseLV4MeshLong(iIndex);

                if (iIndex >= iMaterialCount)
                {
                    LogWarning("Out of range: material index is too large");
                    iIndex = iMaterialCount-1;
                }

                // get a reference to the material
                Material& sMat = m_vMaterials[iIndex+iOldMaterialCount];
                // parse the material block
                ParseLV2MaterialBlock(sMat);
                continue;
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
}